

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O0

void error_to_str_test(void)

{
  int iVar1;
  char *pcVar2;
  char *err_msg;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_status local_54;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  memleak_start();
  local_54 = FDB_RESULT_SUCCESS;
  do {
    if (local_54 < FDB_RESULT_ALREADY_COMPACTED) {
      pcVar2 = fdb_error_msg(local_54);
      iVar1 = strcmp(pcVar2,"unknown error");
      if (iVar1 != 0) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x3d0);
        error_to_str_test::__test_pass = 0;
        iVar1 = strcmp(pcVar2,"unknown error");
        if (iVar1 != 0) {
          __assert_fail("!strcmp(err_msg, \"unknown error\")",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                        ,0x3d0,"void error_to_str_test()");
        }
      }
      memleak_end();
      if (error_to_str_test::__test_pass == 0) {
        fprintf(_stderr,"%s FAILED\n","error to string message test");
      }
      else {
        fprintf(_stderr,"%s PASSED\n","error to string message test");
      }
      return;
    }
    pcVar2 = fdb_error_msg(local_54);
    iVar1 = strcmp(pcVar2,"unknown error");
    if (iVar1 == 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
              ,0x3cb);
      error_to_str_test::__test_pass = 0;
      iVar1 = strcmp(pcVar2,"unknown error");
      if (iVar1 == 0) {
        __assert_fail("strcmp(err_msg, \"unknown error\")",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                      ,0x3cb,"void error_to_str_test()");
      }
    }
    local_54 = local_54 + FDB_RESULT_INVALID_ARGS;
  } while( true );
}

Assistant:

void error_to_str_test()
{
    TEST_INIT();
    memleak_start();
    int i;
    const char *err_msg;

    for (i = FDB_RESULT_SUCCESS; i >= FDB_RESULT_LAST; --i) {
        err_msg = fdb_error_msg((fdb_status)i);
        // Verify that all error codes have corresponding error messages
        TEST_CHK(strcmp(err_msg, "unknown error"));
    }

    err_msg = fdb_error_msg((fdb_status)i);
    // Verify that the last error code has been checked
    TEST_CHK(!strcmp(err_msg, "unknown error"));

    memleak_end();
    TEST_RESULT("error to string message test");
}